

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_tobin.c
# Opt level: O0

int cfg_tobin_tokens(void *reference,char *value,cfg_schema_entry *entries,size_t entry_count,
                    cfg_schema_token_customizer *custom)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  ulong local_168;
  size_t i;
  char *dst;
  char buffer [256];
  char *next_token;
  const_strarray *parameter_ptr;
  const_strarray parameter;
  cfg_schema_token_customizer *custom_local;
  size_t entry_count_local;
  cfg_schema_entry *entries_local;
  char *value_local;
  void *reference_local;
  
  parameter_ptr = (const_strarray *)&dst;
  local_168 = 0;
  buffer._248_8_ = value;
  parameter.length = (size_t)custom;
  while( true ) {
    if (entry_count - 1 <= local_168) {
      if (buffer._248_8_ != 0) {
        lVar3 = entry_count - 1;
        parameter_ptr = (const_strarray *)buffer._248_8_;
        sVar2 = strlen((char *)buffer._248_8_);
        parameter.value = (char *)(sVar2 + 1);
        if ((entries[lVar3].cb_to_binary !=
             (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
           (iVar1 = (*entries[lVar3].cb_to_binary)
                              (entries + lVar3,(const_strarray *)&parameter_ptr,
                               (void *)((long)reference + entries[lVar3].bin_offset)), iVar1 != 0))
        {
          return -1;
        }
      }
      if ((parameter.length == 0) || (*(long *)(parameter.length + 8) == 0)) {
        reference_local._4_4_ = 0;
      }
      else {
        reference_local._4_4_ =
             (**(code **)(parameter.length + 8))(entries,entry_count,value,reference);
      }
      return reference_local._4_4_;
    }
    if (buffer._248_8_ == 0) {
      next_token = (char *)&entries[local_168].def;
    }
    else {
      buffer._248_8_ = str_cpynextword((char *)&dst,(char *)buffer._248_8_,0x100);
      sVar2 = strlen((char *)parameter_ptr);
      parameter.value = (char *)(sVar2 + 1);
      next_token = (char *)&parameter_ptr;
    }
    if ((entries[local_168].cb_to_binary !=
         (_func_int_cfg_schema_entry_ptr_const_strarray_ptr_void_ptr *)0x0) &&
       (iVar1 = (*entries[local_168].cb_to_binary)
                          (entries + local_168,(const_strarray *)next_token,
                           (void *)((long)reference + entries[local_168].bin_offset)), iVar1 != 0))
    break;
    local_168 = local_168 + 1;
  }
  return -1;
}

Assistant:

int
cfg_tobin_tokens(void *reference, const char *value, struct cfg_schema_entry *entries, size_t entry_count,
  struct cfg_schema_token_customizer *custom) {
  struct const_strarray parameter, *parameter_ptr;
  const char *next_token;
  char buffer[256];
  char *dst;
  size_t i;

  dst = reference;
  next_token = value;

  parameter.value = buffer;
  for (i = 0; i < entry_count - 1; i++) {
    if (!next_token) {
      parameter_ptr = &entries[i].def;
    }
    else {
      next_token = str_cpynextword(buffer, next_token, sizeof(buffer));
      parameter.length = strlen(parameter.value) + 1;
      parameter_ptr = &parameter;
    }

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], parameter_ptr, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (next_token) {
    /* we have data for the last entry left */
    i = entry_count - 1;

    parameter.value = next_token;
    parameter.length = strlen(next_token) + 1;

    if (entries[i].cb_to_binary) {
      if (entries[i].cb_to_binary(&entries[i], &parameter, dst + entries[i].bin_offset)) {
        return -1;
      }
    }
  }

  if (custom && custom->cb_tobin) {
    return custom->cb_tobin(entries, entry_count, value, dst);
  }
  return 0;
}